

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

Result __thiscall
testing::internal::FunctionMocker<int_(int,_int,_int,_int,_int,_int,_int,_int,_int)>::
PerformDefaultAction
          (FunctionMocker<int_(int,_int,_int,_int,_int,_int,_int,_int,_int)> *this,
          ArgumentTuple *args,string *call_description)

{
  pointer pcVar1;
  bool bVar2;
  Result RVar3;
  Action<int_(int,_int,_int,_int,_int,_int,_int,_int,_int)> *this_00;
  __normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
  __tmp;
  pointer ppvVar4;
  OnCallSpec<int_(int,_int,_int,_int,_int,_int,_int,_int,_int)> *this_01;
  string message;
  long *local_78 [2];
  long local_68 [2];
  ArgumentTuple local_54;
  
  ppvVar4 = (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
            super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  do {
    if (ppvVar4 ==
        (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
        super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      this_01 = (OnCallSpec<int_(int,_int,_int,_int,_int,_int,_int,_int,_int)> *)0x0;
      break;
    }
    this_01 = (OnCallSpec<int_(int,_int,_int,_int,_int,_int,_int,_int,_int)> *)ppvVar4[-1];
    ppvVar4 = ppvVar4 + -1;
    bVar2 = OnCallSpec<int_(int,_int,_int,_int,_int,_int,_int,_int,_int)>::Matches(this_01,args);
  } while (!bVar2);
  if (this_01 == (OnCallSpec<int_(int,_int,_int,_int,_int,_int,_int,_int,_int)> *)0x0) {
    pcVar1 = (call_description->_M_dataplus)._M_p;
    local_78[0] = local_68;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_78,pcVar1,pcVar1 + call_description->_M_string_length);
    std::__cxx11::string::append((char *)local_78);
    if (DefaultValue<int>::producer_ == (long *)0x0) {
      RVar3 = 0;
    }
    else {
      RVar3 = (**(code **)(*DefaultValue<int>::producer_ + 0x10))();
    }
    if (local_78[0] != local_68) {
      operator_delete(local_78[0],local_68[0] + 1);
    }
  }
  else {
    this_00 = OnCallSpec<int_(int,_int,_int,_int,_int,_int,_int,_int,_int)>::GetAction(this_01);
    local_54.super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int,_int>.
    super__Tuple_impl<1UL,_int,_int,_int,_int,_int,_int,_int,_int>.
    super__Tuple_impl<2UL,_int,_int,_int,_int,_int,_int,_int>.
    super__Tuple_impl<3UL,_int,_int,_int,_int,_int,_int>.
    super__Tuple_impl<4UL,_int,_int,_int,_int,_int>.super__Tuple_impl<5UL,_int,_int,_int,_int>.
    super__Tuple_impl<6UL,_int,_int,_int>.super__Tuple_impl<7UL,_int,_int>.
    super__Tuple_impl<8UL,_int>.super__Head_base<8UL,_int,_false>._M_head_impl =
         *(_Head_base<8UL,_int,_false> *)
          &(args->super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int,_int>).
           super__Tuple_impl<1UL,_int,_int,_int,_int,_int,_int,_int,_int>.
           super__Tuple_impl<2UL,_int,_int,_int,_int,_int,_int,_int>.
           super__Tuple_impl<3UL,_int,_int,_int,_int,_int,_int>.
           super__Tuple_impl<4UL,_int,_int,_int,_int,_int>.
           super__Tuple_impl<5UL,_int,_int,_int,_int>.super__Tuple_impl<6UL,_int,_int,_int>;
    local_54.super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int,_int>.
    super__Tuple_impl<1UL,_int,_int,_int,_int,_int,_int,_int,_int>.
    super__Tuple_impl<2UL,_int,_int,_int,_int,_int,_int,_int>.
    super__Tuple_impl<3UL,_int,_int,_int,_int,_int,_int>.
    super__Tuple_impl<4UL,_int,_int,_int,_int,_int>.super__Tuple_impl<5UL,_int,_int,_int,_int>.
    super__Tuple_impl<6UL,_int,_int,_int>.super__Tuple_impl<7UL,_int,_int>.
    super__Head_base<7UL,_int,_false>._M_head_impl =
         ((_Head_base<7UL,_int,_false> *)
         ((long)&(args->super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int,_int>).
                 super__Tuple_impl<1UL,_int,_int,_int,_int,_int,_int,_int,_int>.
                 super__Tuple_impl<2UL,_int,_int,_int,_int,_int,_int,_int>.
                 super__Tuple_impl<3UL,_int,_int,_int,_int,_int,_int>.
                 super__Tuple_impl<4UL,_int,_int,_int,_int,_int>.
                 super__Tuple_impl<5UL,_int,_int,_int,_int>.super__Tuple_impl<6UL,_int,_int,_int> +
         4))->_M_head_impl;
    local_54.super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int,_int>.
    super__Tuple_impl<1UL,_int,_int,_int,_int,_int,_int,_int,_int>.
    super__Tuple_impl<2UL,_int,_int,_int,_int,_int,_int,_int>.
    super__Tuple_impl<3UL,_int,_int,_int,_int,_int,_int>.
    super__Tuple_impl<4UL,_int,_int,_int,_int,_int>.super__Tuple_impl<5UL,_int,_int,_int,_int>.
    super__Tuple_impl<6UL,_int,_int,_int>.super__Head_base<6UL,_int,_false>._M_head_impl =
         ((_Head_base<6UL,_int,_false> *)
         ((long)&(args->super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int,_int>).
                 super__Tuple_impl<1UL,_int,_int,_int,_int,_int,_int,_int,_int>.
                 super__Tuple_impl<2UL,_int,_int,_int,_int,_int,_int,_int>.
                 super__Tuple_impl<3UL,_int,_int,_int,_int,_int,_int>.
                 super__Tuple_impl<4UL,_int,_int,_int,_int,_int>.
                 super__Tuple_impl<5UL,_int,_int,_int,_int>.super__Tuple_impl<6UL,_int,_int,_int> +
         8))->_M_head_impl;
    local_54.super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int,_int>.
    super__Tuple_impl<1UL,_int,_int,_int,_int,_int,_int,_int,_int>.
    super__Tuple_impl<2UL,_int,_int,_int,_int,_int,_int,_int>.
    super__Tuple_impl<3UL,_int,_int,_int,_int,_int,_int>.
    super__Tuple_impl<4UL,_int,_int,_int,_int,_int>.super__Tuple_impl<5UL,_int,_int,_int,_int>.
    super__Head_base<5UL,_int,_false>._M_head_impl =
         (args->super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int,_int>).
         super__Tuple_impl<1UL,_int,_int,_int,_int,_int,_int,_int,_int>.
         super__Tuple_impl<2UL,_int,_int,_int,_int,_int,_int,_int>.
         super__Tuple_impl<3UL,_int,_int,_int,_int,_int,_int>.
         super__Tuple_impl<4UL,_int,_int,_int,_int,_int>.super__Tuple_impl<5UL,_int,_int,_int,_int>.
         super__Head_base<5UL,_int,_false>._M_head_impl;
    local_54.super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int,_int>.
    super__Tuple_impl<1UL,_int,_int,_int,_int,_int,_int,_int,_int>.
    super__Tuple_impl<2UL,_int,_int,_int,_int,_int,_int,_int>.
    super__Tuple_impl<3UL,_int,_int,_int,_int,_int,_int>.
    super__Tuple_impl<4UL,_int,_int,_int,_int,_int>.super__Head_base<4UL,_int,_false>._M_head_impl =
         (args->super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int,_int>).
         super__Tuple_impl<1UL,_int,_int,_int,_int,_int,_int,_int,_int>.
         super__Tuple_impl<2UL,_int,_int,_int,_int,_int,_int,_int>.
         super__Tuple_impl<3UL,_int,_int,_int,_int,_int,_int>.
         super__Tuple_impl<4UL,_int,_int,_int,_int,_int>.super__Head_base<4UL,_int,_false>.
         _M_head_impl;
    local_54.super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int,_int>.
    super__Tuple_impl<1UL,_int,_int,_int,_int,_int,_int,_int,_int>.
    super__Tuple_impl<2UL,_int,_int,_int,_int,_int,_int,_int>.
    super__Tuple_impl<3UL,_int,_int,_int,_int,_int,_int>.super__Head_base<3UL,_int,_false>.
    _M_head_impl = (args->super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int,_int>).
                   super__Tuple_impl<1UL,_int,_int,_int,_int,_int,_int,_int,_int>.
                   super__Tuple_impl<2UL,_int,_int,_int,_int,_int,_int,_int>.
                   super__Tuple_impl<3UL,_int,_int,_int,_int,_int,_int>.
                   super__Head_base<3UL,_int,_false>._M_head_impl;
    local_54.super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int,_int>.
    super__Tuple_impl<1UL,_int,_int,_int,_int,_int,_int,_int,_int>.
    super__Tuple_impl<2UL,_int,_int,_int,_int,_int,_int,_int>.super__Head_base<2UL,_int,_false>.
    _M_head_impl = (args->super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int,_int>).
                   super__Tuple_impl<1UL,_int,_int,_int,_int,_int,_int,_int,_int>.
                   super__Tuple_impl<2UL,_int,_int,_int,_int,_int,_int,_int>.
                   super__Head_base<2UL,_int,_false>._M_head_impl;
    local_54.super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int,_int>.
    super__Tuple_impl<1UL,_int,_int,_int,_int,_int,_int,_int,_int>.super__Head_base<1UL,_int,_false>
    ._M_head_impl =
         (args->super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int,_int>).
         super__Tuple_impl<1UL,_int,_int,_int,_int,_int,_int,_int,_int>.
         super__Head_base<1UL,_int,_false>._M_head_impl;
    local_54.super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int,_int>.
    super__Head_base<0UL,_int,_false>._M_head_impl =
         (args->super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int,_int>).
         super__Head_base<0UL,_int,_false>._M_head_impl;
    RVar3 = Action<int_(int,_int,_int,_int,_int,_int,_int,_int,_int)>::Perform(this_00,&local_54);
  }
  return RVar3;
}

Assistant:

Result PerformDefaultAction(ArgumentTuple&& args,
                              const std::string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != nullptr) {
      return spec->GetAction().Perform(std::move(args));
    }
    const std::string message =
        call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }